

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O3

void __thiscall fs_tests::fsbridge_fstream::test_method(fsbridge_fstream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  shared_count **ppsVar3;
  pointer pcVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  int iVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar10;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  ofstream *local_3d8;
  path *local_3d0;
  path *local_3c8;
  char *local_3c0;
  assertion_result local_3b8;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_390;
  path p;
  assertion_result local_348;
  char *local_330;
  ofstream file;
  filebuf local_320 [8];
  undefined1 *local_318;
  undefined8 local_310;
  ios_base local_230 [272];
  path local_120;
  path tmpfile2;
  path local_d0;
  path tmpfile1;
  path tmpfolder;
  string input_buffer;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false)
  ;
  std::filesystem::__cxx11::path::path(&local_d0,&tmpfolder.super_path);
  local_3a0._0_8_ = &aStack_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,anon_var_dwarf_a054a8,anon_var_dwarf_a054a8 + 0x11);
  paVar1 = &p.super_path._M_pathname.field_2;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&p,local_3a0._0_8_,
             (char *)(local_3a0._0_8_ + (long)(wrapped_stream *)local_3a0._8_8_));
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&file,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&p,
             auto_format);
  std::filesystem::__cxx11::path::path(&tmpfile2.super_path,(path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(p.super_path._M_pathname._M_dataplus._M_p,
                    p.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_d0,(path *)&tmpfile2);
  std::filesystem::__cxx11::path::path(&tmpfile1.super_path,&local_d0);
  std::filesystem::__cxx11::path::~path(&tmpfile2.super_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != &aStack_390) {
    operator_delete((void *)local_3a0._0_8_,aStack_390._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::path(&local_120,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::path<char8_t[18],std::filesystem::__cxx11::path>
            ((path *)&file,&anon_var_dwarf_a054a8,auto_format);
  std::filesystem::__cxx11::path::operator/=(&local_120,(path *)&file);
  std::filesystem::__cxx11::path::path(&tmpfile2.super_path,&local_120);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path(&local_120);
  std::ofstream::ofstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file,"bitcoin",7);
  uVar5 = _vtable;
  pcVar4 = _VTT;
  _file = (undefined **)_VTT;
  *(undefined8 *)(&file + *(long *)(_VTT + -0x18)) = _vtable;
  std::filebuf::~filebuf(local_320);
  std::ios_base::~ios_base(local_230);
  std::ifstream::ifstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_in);
  input_buffer._M_dataplus._M_p = (pointer)&input_buffer.field_2;
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3d;
  file_00.m_begin = (iterator)&local_3e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3f8,msg);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &input_buffer,"bitcoin");
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  p.super_path._M_pathname.field_2._8_8_ = &local_3d0;
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d8;
  local_3d8 = (ofstream *)0xf69d87;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389798;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d0 = (path *)&input_buffer;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f3a,(size_t)&local_3c8,0x3d,&p,
             "\"bitcoin\"",local_3a0);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_buffer._M_dataplus._M_p != &input_buffer.field_2) {
    operator_delete(input_buffer._M_dataplus._M_p,input_buffer.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&file);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in|_S_ate);
  input_buffer._M_dataplus._M_p = (pointer)&input_buffer.field_2;
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_408;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_418,
             msg_00);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &input_buffer,"");
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  p.super_path._M_pathname.field_2._8_8_ = &local_3d0;
  local_3d8 = (ofstream *)0xf4aea1;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389558;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d8;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d0 = (path *)&input_buffer;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f3a,(size_t)&local_3c8,0x43,&p,
             "\"\"",local_3a0);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_buffer._M_dataplus._M_p != &input_buffer.field_2) {
    operator_delete(input_buffer._M_dataplus._M_p,input_buffer.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&file);
  std::ofstream::ofstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_out|_S_app);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file,"tests",5);
  _file = (undefined **)pcVar4;
  *(undefined8 *)(&file + *(long *)(pcVar4 + -0x18)) = uVar5;
  std::filebuf::~filebuf(local_320);
  std::ios_base::~ios_base(local_230);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in);
  input_buffer._M_dataplus._M_p = (pointer)&input_buffer.field_2;
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4d;
  file_02.m_begin = (iterator)&local_428;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_438,
             msg_01);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &input_buffer,"bitcointests");
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  p.super_path._M_pathname.field_2._8_8_ = &local_3d0;
  local_3d8 = (ofstream *)0xe73f51;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389108;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d8;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d0 = (path *)&input_buffer;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f3a,(size_t)&local_3c8,0x4d,&p,
             "\"bitcointests\"",local_3a0);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_buffer._M_dataplus._M_p != &input_buffer.field_2) {
    operator_delete(input_buffer._M_dataplus._M_p,input_buffer.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&file);
  std::ofstream::ofstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_trunc|_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file,"bitcoin",7);
  _file = (undefined **)pcVar4;
  *(undefined8 *)(&file + *(long *)(pcVar4 + -0x18)) = uVar5;
  std::filebuf::~filebuf(local_320);
  std::ios_base::~ios_base(local_230);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in);
  input_buffer._M_dataplus._M_p = (pointer)&input_buffer.field_2;
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x57;
  file_03.m_begin = (iterator)&local_448;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_458,
             msg_02);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &input_buffer,"bitcoin");
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  p.super_path._M_pathname.field_2._8_8_ = &local_3d0;
  local_3d8 = (ofstream *)0xf69d87;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389798;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d8;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d0 = (path *)&input_buffer;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f3a,(size_t)&local_3c8,0x57,&p,
             "\"bitcoin\"",local_3a0);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_buffer._M_dataplus._M_p != &input_buffer.field_2) {
    operator_delete(input_buffer._M_dataplus._M_p,input_buffer.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&file);
  ppsVar3 = (shared_count **)&local_348.m_message.pn;
  local_348._0_8_ = ppsVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,anon_var_dwarf_a054a8,anon_var_dwarf_a054a8 + 0x11);
  input_buffer._M_dataplus._M_p = (pointer)&input_buffer.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&input_buffer,local_348._0_8_,
             (long)(sp_counted_base **)local_348._0_8_ +
             (long)&((local_348.m_message.px)->m_stream).
                    super_basic_ostream<char,_std::char_traits<char>_>);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&file,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &input_buffer,auto_format);
  std::filesystem::__cxx11::path::path((path *)local_3a0,(path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_buffer._M_dataplus._M_p != &input_buffer.field_2) {
    operator_delete(input_buffer._M_dataplus._M_p,input_buffer.field_2._M_allocated_capacity + 1);
  }
  fsbridge::AbsPathJoin(&p,&tmpfolder,(path *)local_3a0);
  std::filesystem::__cxx11::path::~path((path *)local_3a0);
  if ((shared_count **)local_348._0_8_ != ppsVar3) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)&(local_348.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5c;
  file_04.m_begin = (iterator)&local_468;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_478,
             msg_03);
  _cVar10 = 0x3cf781;
  uVar6 = std::filesystem::__cxx11::path::has_root_directory();
  local_3a0[0] = uVar6;
  local_3a0._8_8_ = (element_type *)0x0;
  aStack_390._M_allocated_capacity = 0;
  input_buffer._M_dataplus._M_p = "p.is_absolute()";
  input_buffer._M_string_length = (long)"p.is_absolute()" + 0xf;
  local_320[0] = (filebuf)0x0;
  _file = &PTR__lazy_ostream_01389048;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_480 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_310 = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              &input_buffer;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a0,(lazy_ostream *)&file,1,0,WARN,_cVar10,(size_t)&local_488
             ,0x5c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_390._M_allocated_capacity);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5d;
  file_05.m_begin = (iterator)&local_498;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4a8,
             msg_04);
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar7 = std::filesystem::__cxx11::path::compare((path *)&tmpfile1);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3b8.m_message.px = (element_type *)0xe73d5f;
  local_320[0] = (filebuf)0x0;
  _file = &PTR__lazy_ostream_01389518;
  local_318 = boost::unit_test::lazy_ostream::inst;
  local_310 = &local_3c8;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389518;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d0;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d0 = (path *)&p;
  local_3c8 = (path *)&tmpfile1;
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_348,(lazy_ostream *)&input_buffer,1,2,REQUIRE,0xe73f7d,(size_t)&local_3b8,0x5d,
             (lazy_ostream *)&file,"p",local_3a0);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  std::filesystem::__cxx11::path::~path(&p.super_path);
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,&tmpfile2);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x62;
  file_06.m_begin = (iterator)&local_4b8;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4c8,
             msg_05);
  _cVar10 = 0x3cf9f6;
  uVar6 = std::filesystem::__cxx11::path::has_root_directory();
  local_3a0[0] = uVar6;
  local_3a0._8_8_ = (element_type *)0x0;
  aStack_390._M_allocated_capacity = 0;
  input_buffer._M_dataplus._M_p = "p.is_absolute()";
  input_buffer._M_string_length = (long)"p.is_absolute()" + 0xf;
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_4d0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  p.super_path._M_pathname.field_2._8_8_ = &input_buffer;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a0,(lazy_ostream *)&p,1,0,WARN,_cVar10,(size_t)&local_4d8,
             0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_390._M_allocated_capacity);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x63;
  file_07.m_begin = (iterator)&local_4e8;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4f8,
             msg_06);
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar7 = std::filesystem::__cxx11::path::compare((path *)&tmpfile2);
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3b8.m_message.px = (element_type *)0xe73d5f;
  p.super_path._M_pathname._M_string_length =
       p.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389518;
  p.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  p.super_path._M_pathname.field_2._8_8_ = &local_3c8;
  local_3d0 = (path *)&file;
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389518;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d0;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3c8 = (path *)&tmpfile2;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,(lazy_ostream *)&input_buffer,1,2,REQUIRE,0xe73f86,(size_t)&local_3b8,99,&p,
             "p",local_3a0);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&file);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x67;
  file_08.m_begin = (iterator)&local_508;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_518,
             msg_07);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_3a0._0_8_ = "";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&p.super_path,(char **)local_3a0,auto_format);
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,&p);
  iVar7 = std::filesystem::__cxx11::path::compare((path *)&tmpfile1);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389518;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d0;
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389518;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = &local_3d8;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_3d8 = &file;
  local_3d0 = (path *)&tmpfile1;
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f7d,(size_t)&local_3c8,0x67,
             local_3a0,"fsbridge::AbsPathJoin(tmpfile1, \"\")",&input_buffer);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path(&p.super_path);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = &DAT_00000068;
  file_09.m_begin = (iterator)&local_528;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_538,
             msg_08);
  local_348.m_message.px = (element_type *)((ulong)local_348.m_message.px & 0xffffffffffffff00);
  local_348._0_8_ = &PTR__lazy_ostream_01388f08;
  local_348.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  p.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  p.super_path._M_pathname.field_2._8_8_ = 0;
  p.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  p.super_path._M_pathname._M_string_length = 0;
  p.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&p.super_path);
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,(path *)&p.super_path);
  iVar7 = std::filesystem::__cxx11::path::compare((path *)&tmpfile1);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar7 == 0);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (path *)0xe73cfe;
  local_3c0 = "";
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01389518;
  aStack_390._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_390._8_8_ = &local_3d0;
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389518;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = &local_3d8;
  local_3d8 = &file;
  local_3d0 = (path *)&tmpfile1;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)&local_348,1,2,REQUIRE,0xe73f7d,(size_t)&local_3c8,0x68,
             local_3a0,"fsbridge::AbsPathJoin(tmpfile1, {})",&input_buffer);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path(&p.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfile2.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfile1.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_fstream)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    // tmpfile1 should be the same as tmpfile2
    fs::path tmpfile1 = tmpfolder / fs::u8path("fs_tests_₿_🏃");
    fs::path tmpfile2 = tmpfolder / fs::path(u8"fs_tests_₿_🏃");
    {
        std::ofstream file{tmpfile1};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile2};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        std::ifstream file{tmpfile1, std::ios_base::in | std::ios_base::ate};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::app};
        file << "tests";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcointests");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::trunc};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        // Join an absolute path and a relative path.
        fs::path p = fsbridge::AbsPathJoin(tmpfolder, fs::u8path("fs_tests_₿_🏃"));
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile1, p);
    }
    {
        // Join two absolute paths.
        fs::path p = fsbridge::AbsPathJoin(tmpfile1, tmpfile2);
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile2, p);
    }
    {
        // Ensure joining with empty paths does not add trailing path components.
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, ""));
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, {}));
    }
}